

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O1

char * glu::getPrecisionName(Precision precision)

{
  return _ZZN3glu16getPrecisionNameENS_9PrecisionEE7s_names_rel +
         *(int *)(_ZZN3glu16getPrecisionNameENS_9PrecisionEE7s_names_rel + (long)(int)precision * 4)
  ;
}

Assistant:

const char* getPrecisionName (Precision precision)
{
	static const char* s_names[] =
	{
		"lowp",
		"mediump",
		"highp"
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_names) == PRECISION_LAST);
	DE_ASSERT(deInBounds32((int)precision, 0, PRECISION_LAST));
	return s_names[(int)precision];
}